

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

optional<std::vector<int,_std::allocator<int>_>_> *
pbrt::SplitStringToInts
          (optional<std::vector<int,_std::allocator<int>_>_> *__return_storage_ptr__,string_view str
          ,char ch)

{
  pointer piVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  int *ptr;
  long lVar3;
  char in_R8B;
  int *piVar4;
  string_view str_00;
  string_view str_01;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> ints;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  
  str_01._M_str._1_7_ = in_register_00000009;
  str_01._M_str._0_1_ = ch;
  str_01._M_len = str._M_str;
  SplitString_abi_cxx11_(&strs,(pbrt *)str._M_len,str_01,in_R8B);
  std::vector<int,_std::allocator<int>_>::vector
            (&ints,(long)strs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)strs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5,&local_49);
  piVar4 = (int *)0xffffffffffffffff;
  lVar3 = 0;
  do {
    piVar1 = ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar4 = (int *)((long)piVar4 + 1);
    ptr = (int *)((long)strs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)strs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
    if (ptr <= piVar4) {
      ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->set = true;
      (__return_storage_ptr__->optionalValue).__align =
           (anon_struct_8_0_00000001_for___align)
           ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      *(pointer *)((long)&__return_storage_ptr__->optionalValue + 8) =
           ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
           ZEXT816(0) << 0x20;
      *(pointer *)((long)&__return_storage_ptr__->optionalValue + 0x10) = piVar1;
      goto LAB_004b6f43;
    }
    str_00._M_str =
         (char *)(lVar3 + (long)ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
    str_00._M_len =
         (size_t)(&(strs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[lVar3]._M_p;
    bVar2 = Atoi((pbrt *)(&(strs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)[lVar3],
                 str_00,ptr);
    lVar3 = lVar3 + 4;
  } while (bVar2);
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
LAB_004b6f43:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ints.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strs);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<std::vector<int>> SplitStringToInts(std::string_view str, char ch) {
    std::vector<std::string> strs = SplitString(str, ch);
    std::vector<int> ints(strs.size());

    for (size_t i = 0; i < strs.size(); ++i)
        if (!Atoi(strs[i], &ints[i]))
            return {};
    return ints;
}